

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

void cdfchi(int *which,double *p,double *q,double *x,double *df,int *status,double *bound)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = *which;
  if (iVar1 - 4U < 0xfffffffd) {
    *bound = *(double *)(&DAT_00112ec0 + (ulong)(iVar1 < 1) * 8);
    *status = -1;
    return;
  }
  if (iVar1 == 1) {
    if (*x <= 0.0 && *x != 0.0) {
LAB_0010855a:
      *bound = 0.0;
      *status = -4;
      return;
    }
    if (*df <= 0.0) {
LAB_00108610:
      *bound = 0.0;
      *status = -5;
      return;
    }
  }
  else {
    dVar4 = *p;
    if ((dVar4 < 0.0) || (1.0 < dVar4)) {
      *bound = (double)(~-(ulong)(dVar4 < 0.0) & 0x3ff0000000000000);
      *status = -2;
      return;
    }
    dVar5 = *q;
    if ((dVar5 <= 0.0) || (1.0 < dVar5)) {
      *bound = (double)(-(ulong)(0.0 < dVar5) & 0x3ff0000000000000);
      *status = -3;
      return;
    }
    if (iVar1 == 2) {
      if (*df <= 0.0) goto LAB_00108610;
    }
    else if (*x <= 0.0 && *x != 0.0) goto LAB_0010855a;
    cdfchi::pq = dVar4 + dVar5;
    dVar5 = cdfchi::pq + -0.5;
    dVar4 = spmpar(&cdfchi::K1);
    if (dVar4 * 3.0 < ABS(dVar5 + -0.5)) {
      *bound = (double)(~-(ulong)(cdfchi::pq < 0.0) & 0x3ff0000000000000);
      *status = 3;
      return;
    }
    iVar1 = *which;
    if (iVar1 != 1) {
      cdfchi::porq = *p;
      dVar4 = *q;
      cdfchi::qporq = (unsigned_long)(cdfchi::porq <= dVar4);
      if (cdfchi::porq > dVar4) {
        cdfchi::porq = dVar4;
      }
      if (iVar1 == 2) {
        *x = 5.0;
        E0000::small = 0.0;
        E0000::big = 1e+300;
        E0000::absstp = 0.5;
        E0000::relstp = 0.5;
        E0000::stpmul = 5.0;
        E0000::abstol = 1e-50;
        E0000::reltol = 1e-08;
        *status = 0;
        do {
          E0000(0,status,x,&cdfchi::fx,&cdfchi::qleft,&cdfchi::qhi,(double *)0x0,(double *)0x0,
                (double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0);
          if (*status != 1) {
            if (*status != -1) {
              return;
            }
            if (cdfchi::qleft != 0) {
              *status = 1;
              *bound = 0.0;
              return;
            }
            goto LAB_001089b5;
          }
          pdVar3 = &cdfchi::cum;
          cumchi(x,df,&cdfchi::cum,&cdfchi::ccum);
          pdVar2 = p;
          if (cdfchi::qporq == 0) {
            pdVar3 = &cdfchi::ccum;
            pdVar2 = q;
          }
          cdfchi::fx = *pdVar3 - *pdVar2;
        } while (cdfchi::fx + cdfchi::porq <= 1.5);
      }
      else {
        if (iVar1 != 3) {
          return;
        }
        *df = 5.0;
        E0000::small = 1e-300;
        E0000::big = 1e+300;
        E0000::absstp = 0.5;
        E0000::relstp = 0.5;
        E0000::stpmul = 5.0;
        E0000::abstol = 1e-50;
        E0000::reltol = 1e-08;
        *status = 0;
        do {
          E0000(0,status,df,&cdfchi::fx,&cdfchi::qleft,&cdfchi::qhi,(double *)0x0,(double *)0x0,
                (double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0,(double *)0x0);
          if (*status != 1) {
            if (*status != -1) {
              return;
            }
            if (cdfchi::qleft == 0) {
LAB_001089b5:
              *status = 2;
              dVar4 = 1e+300;
            }
            else {
              *status = 1;
              dVar4 = 1e-300;
            }
            *bound = dVar4;
            return;
          }
          pdVar3 = &cdfchi::cum;
          cumchi(x,df,&cdfchi::cum,&cdfchi::ccum);
          pdVar2 = p;
          if (cdfchi::qporq == 0) {
            pdVar3 = &cdfchi::ccum;
            pdVar2 = q;
          }
          cdfchi::fx = *pdVar3 - *pdVar2;
        } while (cdfchi::fx + cdfchi::porq <= 1.5);
      }
      goto LAB_00108608;
    }
  }
  *status = 0;
  cumchi(x,df,p,q);
  if (cdfchi::porq <= 1.5) {
    return;
  }
LAB_00108608:
  *status = 10;
  return;
}

Assistant:

void cdfchi(int *which,double *p,double *q,double *x,double *df,
            int *status,double *bound)
/**********************************************************************

      void cdfchi(int *which,double *p,double *q,double *x,double *df,
            int *status,double *bound)

               Cumulative Distribution Function
               CHI-Square distribution


                              Function


     Calculates any one parameter of the chi-square
     distribution given values for the others.


                              Arguments


     WHICH --> Integer indicating which of the next three argument
               values is to be calculated from the others.
               Legal range: 1..3
               iwhich = 1 : Calculate P and Q from X and DF
               iwhich = 2 : Calculate X from P,Q and DF
               iwhich = 3 : Calculate DF from P,Q and X

     P <--> The integral from 0 to X of the chi-square
            distribution.
            Input range: [0, 1].

     Q <--> 1-P.
            Input range: (0, 1].
            P + Q = 1.0.

     X <--> Upper limit of integration of the non-central
            chi-square distribution.
            Input range: [0, +infinity).
            Search range: [0,1E300]

     DF <--> Degrees of freedom of the
             chi-square distribution.
             Input range: (0, +infinity).
             Search range: [ 1E-300, 1E300]

     STATUS <-- 0 if calculation completed correctly
               -I if input parameter number I is out of range
                1 if answer appears to be lower than lowest
                  search bound
                2 if answer appears to be higher than greatest
                  search bound
                3 if P + Q .ne. 1
               10 indicates error returned from cumgam.  See
                  references in cdfgam

     BOUND <-- Undefined if STATUS is 0

               Bound exceeded by parameter number I if STATUS
               is negative.

               Lower search bound if STATUS is 1.

               Upper search bound if STATUS is 2.


                              Method


     Formula    26.4.19   of Abramowitz  and     Stegun, Handbook  of
     Mathematical Functions   (1966) is used   to reduce the chisqure
     distribution to the incomplete distribution.

     Computation of other parameters involve a seach for a value that
     produces  the desired  value  of P.   The search relies  on  the
     monotinicity of P with the other parameter.

**********************************************************************/
{
#define tol (1.0e-8)
#define atol (1.0e-50)
#define zero (1.0e-300)
#define inf 1.0e300
static int K1 = 1;
static double K2 = 0.0e0;
static double K4 = 0.5e0;
static double K5 = 5.0e0;
static double fx,cum,ccum,pq,porq;
static unsigned long qhi,qleft,qporq;
static double T3,T6,T7,T8,T9,T10,T11;
/*
     ..
     .. Executable Statements ..
*/
/*
     Check arguments
*/
    if(!(*which < 1 || *which > 3)) goto S30;
    if(!(*which < 1)) goto S10;
    *bound = 1.0e0;
    goto S20;
S10:
    *bound = 3.0e0;
S20:
    *status = -1;
    return;
S30:
    if(*which == 1) goto S70;
/*
     P
*/
    if(!(*p < 0.0e0 || *p > 1.0e0)) goto S60;
    if(!(*p < 0.0e0)) goto S40;
    *bound = 0.0e0;
    goto S50;
S40:
    *bound = 1.0e0;
S50:
    *status = -2;
    return;
S70:
S60:
    if(*which == 1) goto S110;
/*
     Q
*/
    if(!(*q <= 0.0e0 || *q > 1.0e0)) goto S100;
    if(!(*q <= 0.0e0)) goto S80;
    *bound = 0.0e0;
    goto S90;
S80:
    *bound = 1.0e0;
S90:
    *status = -3;
    return;
S110:
S100:
    if(*which == 2) goto S130;
/*
     X
*/
    if(!(*x < 0.0e0)) goto S120;
    *bound = 0.0e0;
    *status = -4;
    return;
S130:
S120:
    if(*which == 3) goto S150;
/*
     DF
*/
    if(!(*df <= 0.0e0)) goto S140;
    *bound = 0.0e0;
    *status = -5;
    return;
S150:
S140:
    if(*which == 1) goto S190;
/*
     P + Q
*/
    pq = *p+*q;
    if(!(fabs(pq-0.5e0-0.5e0) > 3.0e0*spmpar(&K1))) goto S180;
    if(!(pq < 0.0e0)) goto S160;
    *bound = 0.0e0;
    goto S170;
S160:
    *bound = 1.0e0;
S170:
    *status = 3;
    return;
S190:
S180:
    if(*which == 1) goto S220;
/*
     Select the minimum of P or Q
*/
    qporq = *p <= *q;
    if(!qporq) goto S200;
    porq = *p;
    goto S210;
S200:
    porq = *q;
S220:
S210:
/*
     Calculate ANSWERS
*/
    if(1 == *which) {
/*
     Calculating P and Q
*/
        *status = 0;
        cumchi(x,df,p,q);
        if(porq > 1.5e0) {
            *status = 10;
            return;
        }
    }
    else if(2 == *which) {
/*
     Calculating X
*/
        *x = 5.0e0;
        T3 = inf;
        T6 = atol;
        T7 = tol;
        dstinv(&K2,&T3,&K4,&K4,&K5,&T6,&T7);
        *status = 0;
        dinvr(status,x,&fx,&qleft,&qhi);
S230:
        if(!(*status == 1)) goto S270;
        cumchi(x,df,&cum,&ccum);
        if(!qporq) goto S240;
        fx = cum-*p;
        goto S250;
S240:
        fx = ccum-*q;
S250:
        if(!(fx+porq > 1.5e0)) goto S260;
        *status = 10;
        return;
S260:
        dinvr(status,x,&fx,&qleft,&qhi);
        goto S230;
S270:
        if(!(*status == -1)) goto S300;
        if(!qleft) goto S280;
        *status = 1;
        *bound = 0.0e0;
        goto S290;
S280:
        *status = 2;
        *bound = inf;
S300:
S290:
        ;
    }
    else if(3 == *which) {
/*
     Calculating DF
*/
        *df = 5.0e0;
        T8 = zero;
        T9 = inf;
        T10 = atol;
        T11 = tol;
        dstinv(&T8,&T9,&K4,&K4,&K5,&T10,&T11);
        *status = 0;
        dinvr(status,df,&fx,&qleft,&qhi);
S310:
        if(!(*status == 1)) goto S350;
        cumchi(x,df,&cum,&ccum);
        if(!qporq) goto S320;
        fx = cum-*p;
        goto S330;
S320:
        fx = ccum-*q;
S330:
        if(!(fx+porq > 1.5e0)) goto S340;
        *status = 10;
        return;
S340:
        dinvr(status,df,&fx,&qleft,&qhi);
        goto S310;
S350:
        if(!(*status == -1)) goto S380;
        if(!qleft) goto S360;
        *status = 1;
        *bound = zero;
        goto S370;
S360:
        *status = 2;
        *bound = inf;
S370:
        ;
    }
S380:
    return;
#undef tol
#undef atol
#undef zero
#undef inf
}